

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void jx9_context_free_chunk(jx9_context *pCtx,void *pChunk)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (pChunk == (void *)0x0) {
    return;
  }
  uVar2 = (ulong)(pCtx->sChunk).nUsed;
  if (uVar2 != 0) {
    pvVar1 = (pCtx->sChunk).pBase;
    uVar3 = 0;
    do {
      if (*(void **)((long)pvVar1 + uVar3 * 8) == pChunk) {
        *(undefined8 *)((long)pvVar1 + uVar3 * 8) = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  SyMemBackendFree(&pCtx->pVm->sAllocator,pChunk);
  return;
}

Assistant:

JX9_PRIVATE void jx9_context_free_chunk(jx9_context *pCtx, void *pChunk)
{
	jx9_aux_data *pAux;
	if( pChunk == 0 ){
		/* TICKET-1433-93: NULL chunk is a harmless operation */
		return;
	}
	pAux = ContextFindChunk(pCtx, pChunk);
	if( pAux ){
		/* Mark as destroyed */
		pAux->pAuxData = 0;
	}
	SyMemBackendFree(&pCtx->pVm->sAllocator, pChunk);
}